

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-signal.c
# Opt level: O1

int run_test_we_get_signal_one_shot(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  uv_loop_t *puVar2;
  uint uVar3;
  uv_handle_t *puVar4;
  int64_t eval_b;
  int64_t eval_a;
  timer_ctx tc;
  signal_ctx sc;
  undefined1 auStack_438 [144];
  undefined1 auStack_3a8 [136];
  undefined1 auStack_320 [136];
  undefined1 auStack_298 [136];
  signal_ctx sStack_210;
  uv_loop_t *puStack_180;
  void *local_130;
  undefined1 local_128 [144];
  signal_ctx local_98;
  
  puVar2 = uv_default_loop();
  start_timer(puVar2,0x11,(timer_ctx *)(local_128 + 8));
  start_watcher(puVar2,0x11,&local_98,1);
  local_98.stop_or_close = NOOP;
  iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
  local_128._0_8_ = SEXT48(iVar1);
  local_130 = (void *)0x0;
  if ((void *)local_128._0_8_ == (void *)0x0) {
    local_128._0_8_ = ZEXT48((uint)local_128._8_4_);
    local_130 = (void *)0xa;
    if ((void *)local_128._0_8_ != (void *)0xa) goto LAB_001ba088;
    local_128._0_8_ = (void *)0x1;
    local_130 = (void *)(ulong)local_98.ncalls;
    if (local_130 != (void *)0x1) goto LAB_001ba097;
    start_timer(puVar2,0x11,(timer_ctx *)(local_128 + 8));
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    local_128._0_8_ = SEXT48(iVar1);
    local_130 = (void *)0x0;
    if ((void *)local_128._0_8_ != (void *)0x0) goto LAB_001ba0a6;
    local_128._0_8_ = (void *)0x1;
    local_130 = (void *)(ulong)local_98.ncalls;
    if (local_130 != (void *)0x1) goto LAB_001ba0b5;
    local_98.stop_or_close = CLOSE;
    local_98.ncalls = 0;
    uv_signal_start_oneshot(&local_98.handle,signal_cb_one_shot,0x11);
    start_timer(puVar2,0x11,(timer_ctx *)(local_128 + 8));
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    local_128._0_8_ = SEXT48(iVar1);
    local_130 = (void *)0x0;
    if ((void *)local_128._0_8_ != (void *)0x0) goto LAB_001ba0c4;
    local_128._0_8_ = ZEXT48((uint)local_128._8_4_);
    local_130 = (void *)0xa;
    if ((void *)local_128._0_8_ != (void *)0xa) goto LAB_001ba0d3;
    local_128._0_8_ = (void *)0x1;
    local_130 = (void *)(ulong)local_98.ncalls;
    if (local_130 != (void *)0x1) goto LAB_001ba0e2;
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    uv_run(puVar2,UV_RUN_DEFAULT);
    local_128._0_8_ = (void *)0x0;
    iVar1 = uv_loop_close(puVar2);
    local_130 = (void *)(long)iVar1;
    if ((void *)local_128._0_8_ == local_130) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_we_get_signal_one_shot_cold_1();
LAB_001ba088:
    run_test_we_get_signal_one_shot_cold_2();
LAB_001ba097:
    run_test_we_get_signal_one_shot_cold_3();
LAB_001ba0a6:
    run_test_we_get_signal_one_shot_cold_4();
LAB_001ba0b5:
    run_test_we_get_signal_one_shot_cold_5();
LAB_001ba0c4:
    run_test_we_get_signal_one_shot_cold_6();
LAB_001ba0d3:
    run_test_we_get_signal_one_shot_cold_7();
LAB_001ba0e2:
    run_test_we_get_signal_one_shot_cold_8();
  }
  puVar4 = (uv_handle_t *)local_128;
  uVar3 = (uint)&local_130;
  run_test_we_get_signal_one_shot_cold_9();
  if (uVar3 == puVar4[1].flags) {
    iVar1 = *(int *)&puVar4[-1].field_0x3c + 1;
    *(int *)&puVar4[-1].field_0x3c = iVar1;
    if (iVar1 == 1) {
      if (puVar4[-1].flags == 0) {
        uv_close(puVar4,(uv_close_cb)0x0);
        return extraout_EAX;
      }
      return 1;
    }
  }
  else {
    signal_cb_one_shot_cold_1();
  }
  signal_cb_one_shot_cold_2();
  puStack_180 = puVar2;
  puVar2 = uv_default_loop();
  start_timer(puVar2,0x11,(timer_ctx *)(auStack_438 + 8));
  start_watcher(puVar2,0x11,(signal_ctx *)auStack_3a8,1);
  start_watcher(puVar2,0x11,(signal_ctx *)auStack_320,1);
  auStack_3a8._0_4_ = CLOSE;
  auStack_320._0_4_ = CLOSE;
  iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
  auStack_438._0_8_ = SEXT48(iVar1);
  if ((void *)auStack_438._0_8_ == (void *)0x0) {
    auStack_438._0_8_ = ZEXT48((uint)auStack_438._8_4_);
    if ((void *)auStack_438._0_8_ != (void *)0xa) goto LAB_001ba820;
    auStack_438._0_8_ = (void *)0x1;
    if (auStack_3a8._4_4_ != 1) goto LAB_001ba82f;
    auStack_438._0_8_ = (void *)0x1;
    if (auStack_320._4_4_ != 1) goto LAB_001ba83e;
    start_timer(puVar2,0x11,(timer_ctx *)(auStack_438 + 8));
    start_watcher(puVar2,0x11,(signal_ctx *)auStack_3a8,1);
    start_watcher(puVar2,0x11,(signal_ctx *)auStack_320,1);
    auStack_3a8._0_4_ = CLOSE;
    auStack_320._0_4_ = CLOSE;
    start_watcher(puVar2,0x11,(signal_ctx *)auStack_298,0);
    uv_close((uv_handle_t *)(auStack_298 + 8),(uv_close_cb)0x0);
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    auStack_438._0_8_ = SEXT48(iVar1);
    if ((void *)auStack_438._0_8_ != (void *)0x0) goto LAB_001ba84d;
    auStack_438._0_8_ = ZEXT48((uint)auStack_438._8_4_);
    if ((void *)auStack_438._0_8_ != (void *)0xa) goto LAB_001ba85c;
    auStack_438._0_8_ = (void *)0x1;
    if (auStack_3a8._4_4_ != 1) goto LAB_001ba86b;
    auStack_438._0_8_ = (void *)0x1;
    if (auStack_320._4_4_ != 1) goto LAB_001ba87a;
    auStack_438._0_8_ = ZEXT48((uint)auStack_298._4_4_);
    if ((void *)auStack_438._0_8_ != (void *)0x0) goto LAB_001ba889;
    start_timer(puVar2,0x11,(timer_ctx *)(auStack_438 + 8));
    start_watcher(puVar2,0x11,(signal_ctx *)auStack_3a8,0);
    start_watcher(puVar2,0x11,(signal_ctx *)auStack_320,0);
    auStack_3a8._0_4_ = CLOSE;
    auStack_320._0_4_ = CLOSE;
    start_watcher(puVar2,0x11,(signal_ctx *)auStack_298,1);
    uv_close((uv_handle_t *)(auStack_298 + 8),(uv_close_cb)0x0);
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    auStack_438._0_8_ = SEXT48(iVar1);
    if ((void *)auStack_438._0_8_ != (void *)0x0) goto LAB_001ba898;
    auStack_438._0_8_ = ZEXT48((uint)auStack_438._8_4_);
    if ((void *)auStack_438._0_8_ != (void *)0xa) goto LAB_001ba8a7;
    auStack_438._0_8_ = ZEXT48((uint)auStack_3a8._4_4_);
    if ((void *)auStack_438._0_8_ != (void *)0xa) goto LAB_001ba8b6;
    auStack_438._0_8_ = ZEXT48((uint)auStack_320._4_4_);
    if ((void *)auStack_438._0_8_ != (void *)0xa) goto LAB_001ba8c5;
    auStack_438._0_8_ = ZEXT48((uint)auStack_298._4_4_);
    if ((void *)auStack_438._0_8_ != (void *)0x0) goto LAB_001ba8d4;
    start_timer(puVar2,0x11,(timer_ctx *)(auStack_438 + 8));
    start_watcher(puVar2,0x11,(signal_ctx *)auStack_3a8,0);
    start_watcher(puVar2,0x11,(signal_ctx *)auStack_320,0);
    start_watcher(puVar2,0x11,(signal_ctx *)auStack_298,1);
    start_watcher(puVar2,0x11,&sStack_210,1);
    auStack_298._0_4_ = CLOSE;
    sStack_210.stop_or_close = CLOSE;
    uv_close((uv_handle_t *)(auStack_3a8 + 8),(uv_close_cb)0x0);
    uv_close((uv_handle_t *)(auStack_320 + 8),(uv_close_cb)0x0);
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    auStack_438._0_8_ = SEXT48(iVar1);
    if ((void *)auStack_438._0_8_ != (void *)0x0) goto LAB_001ba8e3;
    auStack_438._0_8_ = ZEXT48((uint)auStack_438._8_4_);
    if ((void *)auStack_438._0_8_ != (void *)0xa) goto LAB_001ba8f2;
    auStack_438._0_8_ = ZEXT48((uint)auStack_3a8._4_4_);
    if ((void *)auStack_438._0_8_ != (void *)0x0) goto LAB_001ba901;
    auStack_438._0_8_ = ZEXT48((uint)auStack_320._4_4_);
    if ((void *)auStack_438._0_8_ != (void *)0x0) goto LAB_001ba910;
    auStack_438._0_8_ = (void *)0x1;
    if (auStack_298._4_4_ != 1) goto LAB_001ba91f;
    auStack_438._0_8_ = (void *)0x1;
    start_timer(puVar2,0x11,(timer_ctx *)(auStack_438 + 8));
    start_watcher(puVar2,0x11,(signal_ctx *)auStack_3a8,0);
    start_watcher(puVar2,0x11,(signal_ctx *)auStack_320,1);
    start_watcher(puVar2,0x11,(signal_ctx *)auStack_298,0);
    start_watcher(puVar2,0x11,&sStack_210,0);
    sStack_210.stop_or_close = CLOSE;
    uv_close((uv_handle_t *)(auStack_3a8 + 8),(uv_close_cb)0x0);
    uv_close((uv_handle_t *)(auStack_298 + 8),(uv_close_cb)0x0);
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    auStack_438._0_8_ = SEXT48(iVar1);
    if ((void *)auStack_438._0_8_ != (void *)0x0) goto LAB_001ba93d;
    auStack_438._0_8_ = ZEXT48((uint)auStack_438._8_4_);
    if ((void *)auStack_438._0_8_ != (void *)0xa) goto LAB_001ba94c;
    auStack_438._0_8_ = ZEXT48((uint)auStack_3a8._4_4_);
    if ((void *)auStack_438._0_8_ != (void *)0x0) goto LAB_001ba95b;
    auStack_438._0_8_ = (void *)0x1;
    if (auStack_320._4_4_ != 1) goto LAB_001ba96a;
    auStack_438._0_8_ = ZEXT48((uint)auStack_298._4_4_);
    if ((void *)auStack_438._0_8_ != (void *)0x0) goto LAB_001ba979;
    auStack_438._0_8_ = ZEXT48(sStack_210.ncalls);
    if ((void *)auStack_438._0_8_ == (void *)0xa) {
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      auStack_438._0_8_ = (void *)0x0;
      iVar1 = uv_loop_close(puVar2);
      if ((void *)auStack_438._0_8_ == (void *)(long)iVar1) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001ba997;
    }
  }
  else {
    run_test_we_get_signals_mixed_cold_1();
LAB_001ba820:
    run_test_we_get_signals_mixed_cold_2();
LAB_001ba82f:
    run_test_we_get_signals_mixed_cold_3();
LAB_001ba83e:
    run_test_we_get_signals_mixed_cold_4();
LAB_001ba84d:
    run_test_we_get_signals_mixed_cold_5();
LAB_001ba85c:
    run_test_we_get_signals_mixed_cold_6();
LAB_001ba86b:
    run_test_we_get_signals_mixed_cold_7();
LAB_001ba87a:
    run_test_we_get_signals_mixed_cold_8();
LAB_001ba889:
    run_test_we_get_signals_mixed_cold_9();
LAB_001ba898:
    run_test_we_get_signals_mixed_cold_10();
LAB_001ba8a7:
    run_test_we_get_signals_mixed_cold_11();
LAB_001ba8b6:
    run_test_we_get_signals_mixed_cold_12();
LAB_001ba8c5:
    run_test_we_get_signals_mixed_cold_13();
LAB_001ba8d4:
    run_test_we_get_signals_mixed_cold_14();
LAB_001ba8e3:
    run_test_we_get_signals_mixed_cold_15();
LAB_001ba8f2:
    run_test_we_get_signals_mixed_cold_16();
LAB_001ba901:
    run_test_we_get_signals_mixed_cold_17();
LAB_001ba910:
    run_test_we_get_signals_mixed_cold_18();
LAB_001ba91f:
    run_test_we_get_signals_mixed_cold_19();
    run_test_we_get_signals_mixed_cold_20();
LAB_001ba93d:
    run_test_we_get_signals_mixed_cold_21();
LAB_001ba94c:
    run_test_we_get_signals_mixed_cold_22();
LAB_001ba95b:
    run_test_we_get_signals_mixed_cold_23();
LAB_001ba96a:
    run_test_we_get_signals_mixed_cold_24();
LAB_001ba979:
    run_test_we_get_signals_mixed_cold_25();
  }
  run_test_we_get_signals_mixed_cold_26();
LAB_001ba997:
  puVar4 = (uv_handle_t *)auStack_438;
  run_test_we_get_signals_mixed_cold_27();
  iVar1 = uv_is_closing(puVar4);
  if (iVar1 == 0) {
    uv_close(puVar4,(uv_close_cb)0x0);
    return extraout_EAX_00;
  }
  return iVar1;
}

Assistant:

TEST_IMPL(we_get_signal_one_shot) {
  struct signal_ctx sc;
  struct timer_ctx tc;
  uv_loop_t* loop;

  loop = uv_default_loop();
  start_timer(loop, SIGCHLD, &tc);
  start_watcher(loop, SIGCHLD, &sc, 1);
  sc.stop_or_close = NOOP;
  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));
  ASSERT_EQ(tc.ncalls, NSIGNALS);
  ASSERT_EQ(1, sc.ncalls);

  start_timer(loop, SIGCHLD, &tc);
  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));
  ASSERT_EQ(1, sc.ncalls);

  sc.ncalls = 0;
  sc.stop_or_close = CLOSE; /* now close it when it's done */
  uv_signal_start_oneshot(&sc.handle, signal_cb_one_shot, SIGCHLD);
  start_timer(loop, SIGCHLD, &tc);
  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));
  ASSERT_EQ(tc.ncalls, NSIGNALS);
  ASSERT_EQ(1, sc.ncalls);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}